

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  Data data;
  Init init;
  Data DStack_1ee8;
  Init local_1e78;
  
  local_1e78.instance.allocation_callbacks = (VkAllocationCallbacks *)0x0;
  local_1e78.instance.fp_vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x0;
  local_1e78.instance.instance = (VkInstance)0x0;
  local_1e78.instance.debug_messenger = (VkDebugUtilsMessengerEXT)0x0;
  local_1e78.instance.fp_vkGetDeviceProcAddr = (PFN_vkGetDeviceProcAddr)0x0;
  local_1e78.instance.instance_version = 0x400000;
  local_1e78.instance.api_version = 0x400000;
  local_1e78.instance.headless = false;
  local_1e78.instance.properties2_ext_enabled = false;
  memset(&local_1e78.inst_disp,0,0x379);
  local_1e78.device.device = (VkDevice)0x0;
  paVar1 = &local_1e78.device.physical_device.name.field_2;
  local_1e78.device.physical_device.name._M_string_length = 0;
  local_1e78.device.physical_device.name.field_2._M_local_buf[0] = '\0';
  local_1e78.device.physical_device.name._M_dataplus._M_p = (pointer)paVar1;
  memset(&local_1e78.device.physical_device.physical_device,0,0xec);
  memset(&local_1e78.device.physical_device.properties,0,0x124);
  memset(&local_1e78.device.physical_device.properties.limits,0,0x20c);
  memset(&local_1e78.device.physical_device.memory_properties,0,0x208);
  local_1e78.device.physical_device.instance_version = 0x400000;
  local_1e78.device.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e78.device.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e78.device.physical_device.extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e78.device.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e78.device.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e78.device.physical_device.available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e78.device.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e78.device.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e78.device.physical_device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e78.device.physical_device.extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e78.device.physical_device.extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e78.device.physical_device.extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e78.device.physical_device.defer_surface_initialization = false;
  local_1e78.device.physical_device.properties2_ext_enabled = false;
  local_1e78.device._1732_8_ = 0;
  local_1e78.device.surface._4_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_1e78.device.queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1e78.device.allocation_callbacks._0_4_ = 0;
  local_1e78.device._1772_8_ = 0;
  local_1e78.device._1780_8_ = 0x40000000000000;
  memset(&local_1e78.device.internal_table,0,0x1391);
  iVar3 = device_initialization(&local_1e78);
  iVar4 = -1;
  if (iVar3 == 0) {
    iVar3 = get_queues(&local_1e78,&DStack_1ee8);
    if (iVar3 == 0) {
      create_descriptor(&local_1e78,&DStack_1ee8);
      create_compute_pipeline(&local_1e78,&DStack_1ee8);
      create_command_pool(&local_1e78,&DStack_1ee8);
      create_buffers(&local_1e78,&DStack_1ee8);
      create_and_submit_work(&local_1e78,&DStack_1ee8);
      iVar4 = 0;
      cleanup((EVP_PKEY_CTX *)&local_1e78);
    }
  }
  pvVar2 = (void *)CONCAT44(local_1e78.device.queue_families.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_1e78.device.queue_families.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_1e78.device.queue_families.
                                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                    local_1e78.device.queue_families.
                                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                           (long)pvVar2);
  }
  if (local_1e78.device.physical_device.extended_features_chain.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e78.device.physical_device.extended_features_chain.nodes.
                    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e78.device.physical_device.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e78.device.physical_device.extended_features_chain.nodes.
                          super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1e78.device.physical_device.queue_families.
      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e78.device.physical_device.queue_families.
                    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e78.device.physical_device.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e78.device.physical_device.queue_families.
                          super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e78.device.physical_device.available_extensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e78.device.physical_device.extensions_to_enable);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e78.device.physical_device.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e78.device.physical_device.name._M_dataplus._M_p,
                    CONCAT71(local_1e78.device.physical_device.name.field_2._M_allocated_capacity.
                             _1_7_,local_1e78.device.physical_device.name.field_2._M_local_buf[0]) +
                    1);
  }
  return iVar4;
}

Assistant:

int main() {
    Init init;
    Data data;

    if (0 != device_initialization(init)) return -1;
    if (0 != get_queues(init, data)) return -1;
    // We are not error checking here, not good practice, but this is just an example program!
    create_descriptor(init, data);
    create_compute_pipeline(init, data);
    create_command_pool(init, data);
    create_buffers(init, data);
    create_and_submit_work(init, data);
    cleanup(init, data);
    return 0;
}